

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt_and_hash.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  FILE *__s;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *pmVar6;
  FILE *pFVar7;
  size_t sVar8;
  mbedtls_cipher_type_t *pmVar9;
  mbedtls_md_type_t *pmVar10;
  size_t sVar11;
  ulong uVar12;
  uchar *puVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  char *__format;
  char *pcVar19;
  bool bVar20;
  size_t sStack_b50;
  size_t olen;
  mbedtls_cipher_info_t *local_b20;
  uint local_b14;
  mbedtls_md_context_t md_ctx;
  int n;
  uchar IV [16];
  mbedtls_cipher_context_t cipher_ctx;
  byte local_a78 [8];
  uchar auStack_a70 [56];
  uchar key [512];
  uchar buffer [1024];
  uchar output [1024];
  
  mbedtls_cipher_init(&cipher_ctx);
  mbedtls_md_init(&md_ctx);
  if (argc != 7) {
    puts(
        "\n  crypt_and_hash <mode> <input filename> <output filename> <cipher> <mbedtls_md> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: crypt_and_hash 0 file file.aes AES-128-CBC SHA1 hex:E76B2413958B00E193\n"
        );
    puts("Available ciphers:");
    for (pmVar9 = (mbedtls_cipher_type_t *)mbedtls_cipher_list(); *pmVar9 != MBEDTLS_CIPHER_NONE;
        pmVar9 = pmVar9 + 1) {
      mbedtls_cipher_info_from_type(*pmVar9);
      printf("  %s\n");
    }
    puts("\nAvailable message digests:");
    pmVar10 = (mbedtls_md_type_t *)mbedtls_md_list();
    iVar4 = 1;
    for (; *pmVar10 != MBEDTLS_MD_NONE; pmVar10 = pmVar10 + 1) {
      pmVar6 = mbedtls_md_info_from_type(*pmVar10);
      mbedtls_md_get_name(pmVar6);
      printf("  %s\n");
    }
    goto LAB_00105f45;
  }
  uVar3 = atoi(argv[1]);
  if (1 < uVar3) {
    pcVar19 = "invalid operation mode\n";
    sStack_b50 = 0x17;
LAB_00105c00:
    fwrite(pcVar19,sStack_b50,1,_stderr);
LAB_00105c27:
    iVar4 = 1;
    goto LAB_00105f45;
  }
  pcVar19 = argv[2];
  iVar4 = strcmp(pcVar19,argv[3]);
  if (iVar4 == 0) {
    pcVar19 = "input and output filenames must differ\n";
    sStack_b50 = 0x27;
    goto LAB_00105c00;
  }
  __stream = fopen(pcVar19,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen(%s,rb) failed\n",argv[2]);
    goto LAB_00105c27;
  }
  __s = fopen(argv[3],"wb+");
  if (__s == (FILE *)0x0) {
    pcVar19 = argv[3];
    __format = "fopen(%s,wb+) failed\n";
LAB_00105c5c:
    fprintf(_stderr,__format,pcVar19);
    iVar4 = 1;
  }
  else {
    cipher_info = mbedtls_cipher_info_from_string(argv[4]);
    if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
      pcVar19 = argv[4];
      __format = "Cipher \'%s\' not found\n";
      goto LAB_00105c5c;
    }
    local_b14 = uVar3;
    iVar4 = mbedtls_cipher_setup(&cipher_ctx,cipher_info);
    if (iVar4 != 0) {
      pcVar19 = "mbedtls_cipher_setup failed\n";
      sStack_b50 = 0x1c;
      goto LAB_00105dfc;
    }
    pmVar6 = mbedtls_md_info_from_string(argv[5]);
    if (pmVar6 == (mbedtls_md_info_t *)0x0) {
      olen = (size_t)argv[5];
      pcVar19 = "Message Digest \'%s\' not found\n";
LAB_00105c9c:
      iVar4 = 0;
      fprintf(_stderr,pcVar19,olen);
    }
    else {
      iVar4 = mbedtls_md_setup(&md_ctx,pmVar6,1);
      if (iVar4 == 0) {
        pFVar7 = fopen(argv[6],"rb");
        local_b20 = cipher_info;
        if (pFVar7 == (FILE *)0x0) {
          piVar18 = (int *)argv[6];
          if (*piVar18 == 0x3a786568) {
            piVar18 = piVar18 + 1;
            for (sVar8 = 0;
                (iVar4 = __isoc99_sscanf(piVar18,"%02X",&n), cipher_info = local_b20, 0 < iVar4 &&
                (sVar8 < 0x200)); sVar8 = sVar8 + 1) {
              key[sVar8] = (uchar)n;
              piVar18 = (int *)((long)piVar18 + 2);
            }
          }
          else {
            sVar11 = strlen((char *)piVar18);
            sVar8 = 0x200;
            if (sVar11 < 0x200) {
              sVar8 = sVar11;
            }
            memcpy(key,piVar18,sVar8);
          }
        }
        else {
          sVar8 = fread(key,1,0x200,pFVar7);
          fclose(pFVar7);
        }
        pcVar19 = argv[6];
        sVar11 = strlen(pcVar19);
        memset(pcVar19,0,sVar11);
        iVar4 = fileno(__stream);
        uVar12 = lseek(iVar4,0,2);
        if ((long)uVar12 < 0) {
          perror("lseek");
          goto LAB_00105f2b;
        }
        iVar4 = fseek(__stream,0,0);
        if (iVar4 < 0) {
          pcVar19 = "fseek(0,SEEK_SET) failed\n";
          sStack_b50 = 0x19;
          goto LAB_00105e1d;
        }
        if ((local_b14 & 1) != 0) {
LAB_0010586d:
          bVar1 = mbedtls_md_get_size(pmVar6);
          if ((long)uVar12 < (long)((ulong)bVar1 + 0x10)) {
            pcVar19 = "File too short to be encrypted.\n";
            sStack_b50 = 0x20;
          }
          else {
            if ((cipher_ctx.cipher_info != (mbedtls_cipher_info_t *)0x0) &&
               ((cipher_ctx.cipher_info)->block_size != 0)) {
              if (cipher_info->mode != MBEDTLS_MODE_GCM) {
                bVar1 = mbedtls_md_get_size(pmVar6);
                uVar3 = 0;
                if ((cipher_ctx.cipher_info != (mbedtls_cipher_info_t *)0x0) &&
                   (uVar3 = (cipher_ctx.cipher_info)->block_size,
                   (long)(uVar12 - bVar1) % (long)(ulong)uVar3 == 0)) goto LAB_001058e5;
                pcVar19 = "File content not a multiple of the block size (%d).\n";
                uVar12 = (ulong)uVar3;
                pFVar7 = _stderr;
                goto LAB_00105f24;
              }
LAB_001058e5:
              bVar1 = mbedtls_md_get_size(pmVar6);
              sVar11 = fread(buffer,1,0x10,__stream);
              if (sVar11 != 0x10) {
                pcVar19 = "fread(%d bytes) failed\n";
                goto LAB_00105db4;
              }
              uVar12 = (uVar12 - bVar1) - 0x10;
              IV[0] = buffer[0];
              IV[1] = buffer[1];
              IV[2] = buffer[2];
              IV[3] = buffer[3];
              IV[4] = buffer[4];
              IV[5] = buffer[5];
              IV[6] = buffer[6];
              IV[7] = buffer[7];
              IV[8] = buffer[8];
              IV[9] = buffer[9];
              IV[10] = buffer[10];
              IV[0xb] = buffer[0xb];
              IV[0xc] = buffer[0xc];
              IV[0xd] = buffer[0xd];
              IV[0xe] = buffer[0xe];
              IV[0xf] = buffer[0xf];
              auStack_a70[8] = '\0';
              auStack_a70[9] = '\0';
              auStack_a70[10] = '\0';
              auStack_a70[0xb] = '\0';
              auStack_a70[0xc] = '\0';
              auStack_a70[0xd] = '\0';
              auStack_a70[0xe] = '\0';
              auStack_a70[0xf] = '\0';
              auStack_a70[0x10] = '\0';
              auStack_a70[0x11] = '\0';
              auStack_a70[0x12] = '\0';
              auStack_a70[0x13] = '\0';
              auStack_a70[0x14] = '\0';
              auStack_a70[0x15] = '\0';
              auStack_a70[0x16] = '\0';
              auStack_a70[0x17] = '\0';
              local_a78[0] = buffer[0];
              local_a78[1] = buffer[1];
              local_a78[2] = buffer[2];
              local_a78[3] = buffer[3];
              local_a78[4] = buffer[4];
              local_a78[5] = buffer[5];
              local_a78[6] = buffer[6];
              local_a78[7] = buffer[7];
              auStack_a70[0] = buffer[8];
              auStack_a70[1] = buffer[9];
              auStack_a70[2] = buffer[10];
              auStack_a70[3] = buffer[0xb];
              auStack_a70[4] = buffer[0xc];
              auStack_a70[5] = buffer[0xd];
              auStack_a70[6] = buffer[0xe];
              auStack_a70[7] = buffer[0xf];
              iVar4 = 0x2000;
              while (bVar20 = iVar4 != 0, iVar4 = iVar4 + -1, bVar20) {
                mbedtls_md_starts(&md_ctx);
                mbedtls_md_update(&md_ctx,local_a78,0x20);
                mbedtls_md_update(&md_ctx,key,sVar8);
                mbedtls_md_finish(&md_ctx,local_a78);
              }
              iVar4 = 0;
              memset(key,0,0x200);
              iVar5 = mbedtls_cipher_setkey
                                (&cipher_ctx,local_a78,local_b20->key_bitlen,MBEDTLS_DECRYPT);
              if (iVar5 != 0) goto LAB_00105d04;
              iVar5 = mbedtls_cipher_set_iv(&cipher_ctx,IV,0x10);
              if (iVar5 == 0) {
                iVar5 = mbedtls_cipher_reset(&cipher_ctx);
                if (iVar5 == 0) {
                  mbedtls_md_hmac_starts(&md_ctx,local_a78,0x20);
                  for (lVar16 = 0; lVar16 < (long)uVar12; lVar16 = lVar16 + uVar15) {
                    lVar17 = (uVar12 & 0xffffffff) - lVar16;
                    if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                      sVar8 = 0;
                      if (lVar17 < 1) goto LAB_00105a59;
                    }
                    else {
                      sVar8 = (size_t)(cipher_ctx.cipher_info)->block_size;
                      if (lVar17 <= (long)sVar8) {
LAB_00105a59:
                        sVar8 = (size_t)(uint)((int)uVar12 - (int)lVar16);
                      }
                    }
                    sVar11 = fread(buffer,1,sVar8,__stream);
                    if (sVar11 != sVar8) {
                      uVar12 = 0;
                      if (cipher_ctx.cipher_info != (mbedtls_cipher_info_t *)0x0) {
                        uVar12 = (ulong)(cipher_ctx.cipher_info)->block_size;
                      }
                      fprintf(_stderr,"fread(%d bytes) failed\n",uVar12);
                      goto LAB_00105f2b;
                    }
                    mbedtls_md_hmac_update(&md_ctx,buffer,sVar8);
                    iVar4 = mbedtls_cipher_update(&cipher_ctx,buffer,sVar8,output,&olen);
                    if (iVar4 != 0) goto LAB_00105d25;
                    sVar8 = fwrite(output,1,olen,__s);
                    if (sVar8 != olen) goto LAB_00105d3b;
                    if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                      uVar15 = 0;
                    }
                    else {
                      uVar15 = (ulong)(cipher_ctx.cipher_info)->block_size;
                    }
                  }
                  mbedtls_md_hmac_finish(&md_ctx,local_a78);
                  bVar1 = mbedtls_md_get_size(pmVar6);
                  sVar8 = fread(buffer,1,(ulong)bVar1,__stream);
                  bVar1 = mbedtls_md_get_size(pmVar6);
                  pFVar7 = _stderr;
                  if (sVar8 != bVar1) {
                    bVar1 = mbedtls_md_get_size(pmVar6);
                    pcVar19 = "fread(%d bytes) failed\n";
                    goto LAB_00105f1e;
                  }
                  bVar1 = 0;
                  for (uVar12 = 0; bVar2 = mbedtls_md_get_size(pmVar6), uVar12 < bVar2;
                      uVar12 = uVar12 + 1) {
                    bVar1 = bVar1 | buffer[uVar12] ^ local_a78[uVar12];
                  }
                  if (bVar1 != 0) {
                    pcVar19 = "HMAC check failed: wrong key, or file corrupted.\n";
                    sStack_b50 = 0x31;
                    goto LAB_00105ed4;
                  }
                  mbedtls_cipher_finish(&cipher_ctx,output,&olen);
                  sVar8 = fwrite(output,1,olen,__s);
                  if (sVar8 != olen) {
                    pcVar19 = "fwrite(%ld bytes) failed\n";
                    goto LAB_00105c9c;
                  }
                  goto LAB_00105edd;
                }
                pcVar19 = "mbedtls_cipher_reset() returned error\n";
                sStack_b50 = 0x26;
              }
              else {
                pcVar19 = "mbedtls_cipher_set_iv() returned error\n";
                sStack_b50 = 0x27;
              }
LAB_00105dfc:
              fwrite(pcVar19,sStack_b50,1,_stderr);
              goto LAB_00105f30;
            }
            pcVar19 = "Invalid cipher block size: 0. \n";
            sStack_b50 = 0x1f;
          }
          fwrite(pcVar19,sStack_b50,1,_stderr);
          goto LAB_00105f2b;
        }
        puVar13 = buffer;
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 8) {
          *puVar13 = (uchar)(uVar12 >> ((byte)lVar16 & 0x3f));
          puVar13 = puVar13 + 1;
        }
        puVar13 = (uchar *)argv[2];
        mbedtls_md_starts(&md_ctx);
        mbedtls_md_update(&md_ctx,buffer,8);
        sVar11 = strlen((char *)puVar13);
        mbedtls_md_update(&md_ctx,puVar13,sVar11);
        mbedtls_md_finish(&md_ctx,local_a78);
        IV[0] = local_a78[0];
        IV[1] = local_a78[1];
        IV[2] = local_a78[2];
        IV[3] = local_a78[3];
        IV[4] = local_a78[4];
        IV[5] = local_a78[5];
        IV[6] = local_a78[6];
        IV[7] = local_a78[7];
        IV[8] = auStack_a70[0];
        IV[9] = auStack_a70[1];
        IV[10] = auStack_a70[2];
        IV[0xb] = auStack_a70[3];
        IV[0xc] = auStack_a70[4];
        IV[0xd] = auStack_a70[5];
        IV[0xe] = auStack_a70[6];
        IV[0xf] = auStack_a70[7];
        sVar11 = fwrite(IV,1,0x10,__s);
        if (sVar11 != 0x10) {
          pcVar19 = "fwrite(%d bytes) failed\n";
LAB_00105db4:
          uVar12 = 0x10;
          pFVar7 = _stderr;
LAB_00105f24:
          fprintf(pFVar7,pcVar19,uVar12);
          goto LAB_00105f2b;
        }
        auStack_a70[8] = '\0';
        auStack_a70[9] = '\0';
        auStack_a70[10] = '\0';
        auStack_a70[0xb] = '\0';
        auStack_a70[0xc] = '\0';
        auStack_a70[0xd] = '\0';
        auStack_a70[0xe] = '\0';
        auStack_a70[0xf] = '\0';
        auStack_a70[0x10] = '\0';
        auStack_a70[0x11] = '\0';
        auStack_a70[0x12] = '\0';
        auStack_a70[0x13] = '\0';
        auStack_a70[0x14] = '\0';
        auStack_a70[0x15] = '\0';
        auStack_a70[0x16] = '\0';
        auStack_a70[0x17] = '\0';
        local_a78[0] = IV[0];
        local_a78[1] = IV[1];
        local_a78[2] = IV[2];
        local_a78[3] = IV[3];
        local_a78[4] = IV[4];
        local_a78[5] = IV[5];
        local_a78[6] = IV[6];
        local_a78[7] = IV[7];
        auStack_a70[0] = IV[8];
        auStack_a70[1] = IV[9];
        auStack_a70[2] = IV[10];
        auStack_a70[3] = IV[0xb];
        auStack_a70[4] = IV[0xc];
        auStack_a70[5] = IV[0xd];
        auStack_a70[6] = IV[0xe];
        auStack_a70[7] = IV[0xf];
        iVar4 = 0x2000;
        while (bVar20 = iVar4 != 0, iVar4 = iVar4 + -1, bVar20) {
          mbedtls_md_starts(&md_ctx);
          mbedtls_md_update(&md_ctx,local_a78,0x20);
          mbedtls_md_update(&md_ctx,key,sVar8);
          mbedtls_md_finish(&md_ctx,local_a78);
        }
        memset(key,0,0x200);
        iVar4 = mbedtls_cipher_setkey(&cipher_ctx,local_a78,local_b20->key_bitlen,MBEDTLS_ENCRYPT);
        if (iVar4 != 0) {
LAB_00105d04:
          fwrite("mbedtls_cipher_setkey() returned error\n",0x27,1,_stderr);
          goto LAB_00105f2b;
        }
        iVar4 = mbedtls_cipher_set_iv(&cipher_ctx,IV,0x10);
        if (iVar4 != 0) {
          pcVar19 = "mbedtls_cipher_set_iv() returned error\n";
          sStack_b50 = 0x27;
LAB_00105e1d:
          fwrite(pcVar19,sStack_b50,1,_stderr);
          goto LAB_00105f2b;
        }
        iVar4 = mbedtls_cipher_reset(&cipher_ctx);
        if (iVar4 != 0) {
          pcVar19 = "mbedtls_cipher_reset() returned error\n";
          sStack_b50 = 0x26;
          goto LAB_00105e1d;
        }
        mbedtls_md_hmac_starts(&md_ctx,local_a78,0x20);
        for (lVar16 = 0; lVar16 < (long)uVar12; lVar16 = lVar16 + uVar15) {
          lVar17 = (uVar12 & 0xffffffff) - lVar16;
          if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
            sVar11 = 0;
            if (lVar17 < 1) goto LAB_00105709;
          }
          else {
            sVar11 = (size_t)(cipher_ctx.cipher_info)->block_size;
            if (lVar17 <= (long)sVar11) {
LAB_00105709:
              sVar11 = (size_t)(uint)((int)uVar12 - (int)lVar16);
            }
          }
          sVar14 = fread(buffer,1,sVar11,__stream);
          if (sVar14 != sVar11) {
            pcVar19 = "fread(%ld bytes) failed\n";
            goto LAB_00105e71;
          }
          iVar4 = mbedtls_cipher_update(&cipher_ctx,buffer,sVar11,output,&olen);
          if (iVar4 != 0) goto LAB_00105d25;
          mbedtls_md_hmac_update(&md_ctx,output,olen);
          sVar11 = fwrite(output,1,olen,__s);
          if (sVar11 != olen) goto LAB_00105d3b;
          if (cipher_ctx.cipher_info == (mbedtls_cipher_info_t *)0x0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (ulong)(cipher_ctx.cipher_info)->block_size;
          }
        }
        iVar4 = mbedtls_cipher_finish(&cipher_ctx,output,&olen);
        if (iVar4 != 0) {
          pcVar19 = "mbedtls_cipher_finish() returned error\n";
          goto LAB_00105eac;
        }
        mbedtls_md_hmac_update(&md_ctx,output,olen);
        sVar11 = fwrite(output,1,olen,__s);
        if (sVar11 == olen) {
          mbedtls_md_hmac_finish(&md_ctx,local_a78);
          bVar1 = mbedtls_md_get_size(pmVar6);
          sVar11 = fwrite(local_a78,1,(ulong)bVar1,__s);
          bVar1 = mbedtls_md_get_size(pmVar6);
          pFVar7 = _stderr;
          if (sVar11 == bVar1) {
            cipher_info = local_b20;
            if (local_b14 != 1) goto LAB_00105f2b;
            goto LAB_0010586d;
          }
          bVar1 = mbedtls_md_get_size(pmVar6);
          pcVar19 = "fwrite(%d bytes) failed\n";
LAB_00105f1e:
          uVar12 = (ulong)bVar1;
          goto LAB_00105f24;
        }
        iVar4 = 0;
        fprintf(_stderr,"fwrite(%ld bytes) failed\n");
      }
      else {
        pcVar19 = "mbedtls_md_setup failed\n";
        sStack_b50 = 0x18;
LAB_00105ed4:
        fwrite(pcVar19,sStack_b50,1,_stderr);
LAB_00105edd:
        iVar4 = 0;
      }
    }
  }
  goto LAB_00105f30;
LAB_00105d25:
  pcVar19 = "mbedtls_cipher_update() returned error\n";
LAB_00105eac:
  fwrite(pcVar19,0x27,1,_stderr);
  goto LAB_00105f2b;
LAB_00105d3b:
  pcVar19 = "fwrite(%ld bytes) failed\n";
  sVar11 = olen;
LAB_00105e71:
  fprintf(_stderr,pcVar19,sVar11);
LAB_00105f2b:
  iVar4 = 0;
LAB_00105f30:
  fclose(__stream);
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
LAB_00105f45:
  memset(buffer,0,0x400);
  local_a78[0] = 0;
  local_a78[1] = 0;
  local_a78[2] = 0;
  local_a78[3] = 0;
  local_a78[4] = 0;
  local_a78[5] = 0;
  local_a78[6] = 0;
  local_a78[7] = 0;
  auStack_a70[0] = '\0';
  auStack_a70[1] = '\0';
  auStack_a70[2] = '\0';
  auStack_a70[3] = '\0';
  auStack_a70[4] = '\0';
  auStack_a70[5] = '\0';
  auStack_a70[6] = '\0';
  auStack_a70[7] = '\0';
  auStack_a70[8] = '\0';
  auStack_a70[9] = '\0';
  auStack_a70[10] = '\0';
  auStack_a70[0xb] = '\0';
  auStack_a70[0xc] = '\0';
  auStack_a70[0xd] = '\0';
  auStack_a70[0xe] = '\0';
  auStack_a70[0xf] = '\0';
  auStack_a70[0x10] = '\0';
  auStack_a70[0x11] = '\0';
  auStack_a70[0x12] = '\0';
  auStack_a70[0x13] = '\0';
  auStack_a70[0x14] = '\0';
  auStack_a70[0x15] = '\0';
  auStack_a70[0x16] = '\0';
  auStack_a70[0x17] = '\0';
  auStack_a70[0x18] = '\0';
  auStack_a70[0x19] = '\0';
  auStack_a70[0x1a] = '\0';
  auStack_a70[0x1b] = '\0';
  auStack_a70[0x1c] = '\0';
  auStack_a70[0x1d] = '\0';
  auStack_a70[0x1e] = '\0';
  auStack_a70[0x1f] = '\0';
  auStack_a70[0x20] = '\0';
  auStack_a70[0x21] = '\0';
  auStack_a70[0x22] = '\0';
  auStack_a70[0x23] = '\0';
  auStack_a70[0x24] = '\0';
  auStack_a70[0x25] = '\0';
  auStack_a70[0x26] = '\0';
  auStack_a70[0x27] = '\0';
  auStack_a70[0x28] = '\0';
  auStack_a70[0x29] = '\0';
  auStack_a70[0x2a] = '\0';
  auStack_a70[0x2b] = '\0';
  auStack_a70[0x2c] = '\0';
  auStack_a70[0x2d] = '\0';
  auStack_a70[0x2e] = '\0';
  auStack_a70[0x2f] = '\0';
  auStack_a70[0x30] = '\0';
  auStack_a70[0x31] = '\0';
  auStack_a70[0x32] = '\0';
  auStack_a70[0x33] = '\0';
  auStack_a70[0x34] = '\0';
  auStack_a70[0x35] = '\0';
  auStack_a70[0x36] = '\0';
  auStack_a70[0x37] = '\0';
  mbedtls_cipher_free(&cipher_ctx);
  mbedtls_md_free(&md_ctx);
  return iVar4;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i, n;
    int mode;
    size_t keylen, ilen, olen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[MBEDTLS_MD_MAX_SIZE];
    unsigned char buffer[1024];
    unsigned char output[1024];
    unsigned char diff;

    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;
    mbedtls_cipher_context_t cipher_ctx;
    mbedtls_md_context_t md_ctx;
#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_cipher_init( &cipher_ctx );
    mbedtls_md_init( &md_ctx );

    /*
     * Parse the command-line arguments.
     */
    if( argc != 7 )
    {
        const int *list;

        mbedtls_printf( USAGE );

        mbedtls_printf( "Available ciphers:\n" );
        list = mbedtls_cipher_list();
        while( *list )
        {
            cipher_info = mbedtls_cipher_info_from_type( *list );
            mbedtls_printf( "  %s\n", cipher_info->name );
            list++;
        }

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalid operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the Cipher and MD from the command line
     */
    cipher_info = mbedtls_cipher_info_from_string( argv[4] );
    if( cipher_info == NULL )
    {
        mbedtls_fprintf( stderr, "Cipher '%s' not found\n", argv[4] );
        goto exit;
    }
    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info) ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_cipher_setup failed\n" );
        goto exit;
    }

    md_info = mbedtls_md_info_from_string( argv[5] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[5] );
        goto exit;
    }

    if( mbedtls_md_setup( &md_ctx, md_info, 1 ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_md_setup failed\n" );
        goto exit;
    }

    /*
     * Read the secret key and clean the command line.
     */
    if( ( fkey = fopen( argv[6], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[6], "hex:", 4 ) == 0 )
        {
            p = &argv[6][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[6] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[6], keylen );
        }
    }

    memset( argv[6], 0, strlen( argv[6] ) );

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = MD( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &md_ctx );
        mbedtls_md_update( &md_ctx, buffer, 8 );
        mbedtls_md_update( &md_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &md_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );

        }

        memset( key, 0, sizeof( key ) );

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_ENCRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n");
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%ld bytes) failed\n", (long) ilen );
                goto exit;
            }

            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output, &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n");
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, output, olen );

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        if( mbedtls_cipher_finish( &cipher_ctx, output, &olen ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_finish() returned error\n" );
            goto exit;
        }
        mbedtls_md_hmac_update( &md_ctx, output, olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fwrite( digest, 1, mbedtls_md_get_size( md_info ), fout ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + n    Hash(ciphertext)
         */
        if( filesize < 16 + mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( mbedtls_cipher_get_block_size( &cipher_ctx ) == 0 )
        {
            mbedtls_fprintf( stderr, "Invalid cipher block size: 0. \n" );
            goto exit;
        }

        /*
         * Check the file size.
         */
        if( cipher_info->mode != MBEDTLS_MODE_GCM &&
            ( ( filesize - mbedtls_md_get_size( md_info ) ) %
                mbedtls_cipher_get_block_size( &cipher_ctx ) ) != 0 )
        {
            mbedtls_fprintf( stderr, "File content not a multiple of the block size (%d).\n",
                     mbedtls_cipher_get_block_size( &cipher_ctx ));
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + mbedtls_md_get_size( md_info ) );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_DECRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n" );
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n",
                    mbedtls_cipher_get_block_size( &cipher_ctx ) );
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, buffer, ilen );
            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output,
                                       &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n" );
                goto exit;
            }

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fread( buffer, 1, mbedtls_md_get_size( md_info ), fin ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < mbedtls_md_get_size( md_info ); i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }

        /*
         * Write the final block of data
         */
        mbedtls_cipher_finish( &cipher_ctx, output, &olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_cipher_free( &cipher_ctx );
    mbedtls_md_free( &md_ctx );

    return( ret );
}